

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

Block * Js::CompoundString::Block::New
                  (void *buffer,CharCount usedCharLength,bool reserveMoreSpace,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  uint size;
  CharCount charCapacity;
  undefined4 *puVar3;
  Recycler *alloc;
  Block *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x4a,"(buffer)","buffer");
    if (!bVar2) goto LAB_00a06db3;
    *puVar3 = 0;
  }
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x4b,"(recycler)","recycler");
    if (!bVar2) {
LAB_00a06db3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  size = SizeFromUsedCharLength(usedCharLength);
  if (reserveMoreSpace) {
    size = GrowSize(size);
  }
  data.typeinfo = (type_info *)((ulong)size - 0x18);
  local_58 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5f72374;
  data.filename._0_4_ = 0x50;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
  this = (Block *)new<Memory::Recycler>(0x18,alloc,0x37ff80,0);
  charCapacity = CharCapacityFromSize(size);
  Block(this,buffer,usedCharLength,charCapacity);
  return this;
}

Assistant:

CompoundString::Block *CompoundString::Block::New(
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        Recycler *const recycler)
    {
        Assert(buffer);
        Assert(recycler);

        uint size = SizeFromUsedCharLength(usedCharLength);
        if(reserveMoreSpace)
            size = GrowSize(size);
        return RecyclerNewPlus(recycler, size - sizeof(Block), Block, buffer, usedCharLength, CharCapacityFromSize(size));
    }